

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  void **ppvVar1;
  void *pvVar2;
  _Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
  *this_00;
  Node *item;
  bool bVar3;
  LogMessage *pLVar4;
  Node *pNVar5;
  size_type sVar6;
  size_type sVar7;
  LogFinisher local_a1;
  TreeIterator local_a0;
  LogMessage local_98;
  LogMessage local_60;
  
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x2d9);
    pLVar4 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar4);
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_a0._M_node = (_Base_ptr)0x0;
  bVar3 = iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
          ::revalidate_if_necessary(&it,&local_a0);
  sVar7 = it.bucket_index_;
  item = it.node_;
  ppvVar1 = this->table_;
  pvVar2 = ppvVar1[it.bucket_index_];
  if (bVar3) {
    if (pvVar2 == (void *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pvVar2 != ppvVar1[it.bucket_index_ ^ 1];
    }
    if (!bVar3) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2df);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=(&local_a1,pLVar4);
      internal::LogMessage::~LogMessage(&local_98);
    }
    pNVar5 = EraseFromLinkedList(this,item,(Node *)this->table_[sVar7]);
    sVar6 = sVar7;
  }
  else {
    if (pvVar2 == (void *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pvVar2 == ppvVar1[it.bucket_index_ ^ 1];
    }
    if (!bVar3) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2e4);
      pLVar4 = internal::LogMessage::operator<<(&local_98,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=(&local_a1,pLVar4);
      internal::LogMessage::~LogMessage(&local_98);
    }
    this_00 = (_Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
               *)this->table_[sVar7];
    std::
    _Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
    ::_M_erase_aux(this_00,(const_iterator)local_a0._M_node);
    if ((this_00->_M_impl).super__Rb_tree_header._M_node_count != 0) goto LAB_003b0f5c;
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      std::
      _Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
      ::~_Rb_tree(this_00);
      operator_delete(this_00);
    }
    sVar6 = sVar7 & 0xfffffffffffffffe;
    *(undefined8 *)((long)this->table_ + (sVar7 << 3 | 8)) = 0;
    pNVar5 = (Node *)0x0;
  }
  this->table_[sVar6] = pNVar5;
  sVar7 = sVar6;
LAB_003b0f5c:
  DestroyNode(this,item);
  this->num_elements_ = this->num_elements_ - 1;
  if (sVar7 == this->index_of_first_non_null_) {
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::erase();
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = nullptr;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == nullptr) {
          ++index_of_first_non_null_;
        }
      }
    }